

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimpledrag.cpp
# Opt level: O0

void __thiscall QBasicDrag::cancel(QBasicDrag *this)

{
  QBasicDrag *in_RDI;
  undefined1 in_stack_ffffffffffffffef;
  
  disableEventFilter(in_RDI);
  restoreCursor(in_RDI);
  QWindow::setVisible((QWindow *)in_RDI,(bool)in_stack_ffffffffffffffef);
  return;
}

Assistant:

void QBasicDrag::cancel()
{
    disableEventFilter();
    restoreCursor();
    m_drag_icon_window->setVisible(false);
}